

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void cleanup_hints(void)

{
  hint *phVar1;
  hint *next;
  hint *h;
  
  next = hints;
  while (next != (hint *)0x0) {
    phVar1 = next->next;
    string_free(next->hint);
    mem_free(next);
    next = phVar1;
  }
  return;
}

Assistant:

static void cleanup_hints(void)
{
	struct hint *h, *next;

	h = hints;
	while(h) {
		next = h->next;
		string_free(h->hint);
		mem_free(h);
		h = next;
	}
}